

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

upb_MessageValue upb_Array_Get(upb_Array *arr,size_t i)

{
  ulong uVar1;
  sbyte sVar2;
  upb_MessageValue ret;
  upb_MessageValue local_18;
  
  if (i < arr->size_dont_copy_me__upb_internal_use_only) {
    uVar1 = arr->data_dont_copy_me__upb_internal_use_only;
    sVar2 = ((uVar1 & 3) != 0) + ((byte)uVar1 & 3);
    memcpy(&local_18,(void *)((i << sVar2) + (uVar1 & 0xfffffffffffffff8)),(ulong)(uint)(1 << sVar2)
          );
    return local_18;
  }
  __assert_fail("i < upb_Array_Size(arr)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                ,0x1d,"upb_MessageValue upb_Array_Get(const upb_Array *, size_t)");
}

Assistant:

upb_MessageValue upb_Array_Get(const upb_Array* arr, size_t i) {
  UPB_ASSERT(i < upb_Array_Size(arr));
  upb_MessageValue ret;
  const char* data = upb_Array_DataPtr(arr);
  const int lg2 = UPB_PRIVATE(_upb_Array_ElemSizeLg2)(arr);
  memcpy(&ret, data + (i << lg2), 1 << lg2);
  return ret;
}